

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrintValidatorTests.cpp
# Opt level: O3

int testAudioFeatureSoundPrintBasic(void)

{
  Rep *pRVar1;
  ulong uVar2;
  TypeUnion this;
  bool bVar3;
  ArrayFeatureType *pAVar4;
  FeatureType *this_00;
  FeatureType *this_01;
  ModelDescription *this_02;
  void *pvVar5;
  FeatureDescription *pFVar6;
  void *pvVar7;
  ostream *poVar8;
  AudioFeaturePrint_Sound *pAVar9;
  Arena *pAVar10;
  int iVar11;
  Arena *pAVar12;
  Result result;
  Model model;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Model local_88;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pAVar4 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar4,(Arena *)0x0,false);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00,(Arena *)0x0,false);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_00,pAVar4);
  pAVar4 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar4,(Arena *)0x0,false);
  this_01 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_01,(Arena *)0x0,false);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_01,pAVar4);
  this_02 = (ModelDescription *)operator_new(0xb0);
  CoreML::Specification::ModelDescription::ModelDescription(this_02,(Arena *)0x0,false);
  pRVar1 = (this_02->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar1 == (Rep *)0x0) {
LAB_001a26e2:
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((this_02->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar5 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(this_02->input_).super_RepeatedPtrFieldBase,pFVar6);
  }
  else {
    iVar11 = (this_02->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar1->allocated_size <= iVar11) goto LAB_001a26e2;
    (this_02->input_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
    pvVar5 = pRVar1->elements[iVar11];
  }
  pRVar1 = (this_02->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar1 == (Rep *)0x0) {
LAB_001a271b:
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((this_02->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar7 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(this_02->output_).super_RepeatedPtrFieldBase,pFVar6);
  }
  else {
    iVar11 = (this_02->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar1->allocated_size <= iVar11) goto LAB_001a271b;
    (this_02->output_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
    pvVar7 = pRVar1->elements[iVar11];
  }
  pAVar12 = (Arena *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar5 + 8) & 1) != 0) {
    pAVar12 = *(Arena **)pAVar12;
  }
  if ((pAVar12 == (Arena *)0x0) && (*(long **)((long)pvVar5 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar5 + 0x20) + 8))();
  }
  uVar2 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 2) == 0) {
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
  }
  else {
    pAVar10 = (Arena *)0x0;
  }
  if (pAVar12 != pAVar10) {
    this_00 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar12,(MessageLite *)this_00,pAVar10);
  }
  *(FeatureType **)((long)pvVar5 + 0x20) = this_00;
  pAVar12 = (Arena *)(*(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar7 + 8) & 1) != 0) {
    pAVar12 = *(Arena **)pAVar12;
  }
  if ((pAVar12 == (Arena *)0x0) && (*(long **)((long)pvVar7 + 0x20) != (long *)0x0)) {
    (**(code **)(**(long **)((long)pvVar7 + 0x20) + 8))();
  }
  uVar2 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 2) == 0) {
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
  }
  else {
    pAVar10 = (Arena *)0x0;
  }
  if (pAVar12 != pAVar10) {
    this_01 = (FeatureType *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar12,(MessageLite *)this_01,pAVar10);
  }
  *(FeatureType **)((long)pvVar7 + 0x20) = this_01;
  CoreML::Specification::Model::Model(&local_88,(Arena *)0x0,false);
  pAVar12 = (Arena *)(local_88.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
  if ((local_88.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    pAVar12 = *(Arena **)pAVar12;
  }
  if (pAVar12 == (Arena *)0x0) {
    if (local_88.description_ != (ModelDescription *)0x0) {
      CoreML::Specification::ModelDescription::~ModelDescription(local_88.description_);
    }
    operator_delete(local_88.description_,0xb0);
  }
  uVar2 = (this_02->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 2) == 0) {
    pAVar10 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
  }
  else {
    pAVar10 = (Arena *)0x0;
  }
  if (pAVar12 != pAVar10) {
    this_02 = (ModelDescription *)
              google::protobuf::internal::GetOwnedMessageInternal
                        (pAVar12,(MessageLite *)this_02,pAVar10);
  }
  local_88.description_ = this_02;
  CoreML::validate<(MLModelType)2006>((Result *)local_b0,&local_88);
  bVar3 = CoreML::Result::good((Result *)local_b0);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((result).good())",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    iVar11 = 1;
    std::ostream::flush();
  }
  else {
    if (local_88._oneof_case_[0] != 0x7d6) {
      CoreML::Specification::Model::clear_Type(&local_88);
      local_88._oneof_case_[0] = 0x7d6;
      pAVar12 = (Arena *)(local_88.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if ((local_88.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        pAVar12 = *(Arena **)pAVar12;
      }
      local_88.Type_.audiofeatureprint_ =
           google::protobuf::Arena::
           CreateMaybeMessage<CoreML::Specification::CoreMLModels::AudioFeaturePrint>(pAVar12);
    }
    this = local_88.Type_;
    CoreML::validate<(MLModelType)2006>((Result *)local_58,&local_88);
    local_b0 = local_58;
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    bVar3 = CoreML::Result::good((Result *)local_b0);
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((result).good())",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    }
    else {
      if (*(uint32_t *)
           ((long)&(this.supportvectorclassifier_)->numberofsupportvectorsperclass_ + 0xc) != 0x14)
      {
        CoreML::Specification::CoreMLModels::AudioFeaturePrint::clear_AudioFeaturePrintType
                  (this.audiofeatureprint_);
        *(uint32_t *)((long)&(this.supportvectorclassifier_)->numberofsupportvectorsperclass_ + 0xc)
             = 0x14;
        uVar2 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
        pAVar12 = (Arena *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          pAVar12 = *(Arena **)pAVar12;
        }
        pAVar9 = google::protobuf::Arena::
                 CreateMaybeMessage<CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound>
                           (pAVar12);
        ((AudioFeaturePrintTypeUnion *)&(this.pipelineclassifier_)->pipeline_)->sound_ = pAVar9;
      }
      CoreML::validate<(MLModelType)2006>((Result *)local_58,&local_88);
      local_b0 = local_58;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      bVar3 = CoreML::Result::good((Result *)local_b0);
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x31);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((result).good())",0x12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      }
      else {
        if (*(uint32_t *)
             ((long)&(this.supportvectorclassifier_)->numberofsupportvectorsperclass_ + 0xc) == 0x14
           ) {
          pAVar9 = ((AudioFeaturePrintTypeUnion *)&(this.pipelineclassifier_)->pipeline_)->sound_;
        }
        else {
          CoreML::Specification::CoreMLModels::AudioFeaturePrint::clear_AudioFeaturePrintType
                    (this.audiofeatureprint_);
          *(uint32_t *)
           ((long)&(this.supportvectorclassifier_)->numberofsupportvectorsperclass_ + 0xc) = 0x14;
          uVar2 = ((this.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
          pAVar12 = (Arena *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            pAVar12 = *(Arena **)pAVar12;
          }
          pAVar9 = google::protobuf::Arena::
                   CreateMaybeMessage<CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound>
                             (pAVar12);
          ((AudioFeaturePrintTypeUnion *)&(this.pipelineclassifier_)->pipeline_)->sound_ = pAVar9;
        }
        pAVar9->version_ = 1;
        CoreML::validate<(MLModelType)2006>((Result *)local_58,&local_88);
        local_b0 = local_58;
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        bVar3 = CoreML::Result::good((Result *)local_b0);
        iVar11 = 0;
        if (bVar3) goto LAB_001a2cc0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                   ,0x77);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x35);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(result).good()",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      }
    }
    std::ostream::put((char)poVar8);
    iVar11 = 1;
    std::ostream::flush();
  }
LAB_001a2cc0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_88);
  return iVar11;
}

Assistant:

int testAudioFeatureSoundPrintBasic() {

    Specification::ArrayFeatureType* inputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_multiarraytype(inputArrayFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *p = model.mutable_audiofeatureprint();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound()->set_version(Specification::CoreMLModels::AudioFeaturePrint_Sound_SoundVersion_SOUND_VERSION_1);
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}